

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O2

void setIC(N_Vector yy,N_Vector yp,UserData data)

{
  double dVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  undefined8 *puVar4;
  long lVar5;
  double __x;
  double dVar6;
  undefined1 auVar7 [16];
  sunrealtype Q [3];
  undefined1 local_38 [16];
  double local_28;
  
  N_VConst();
  N_VConst(yp);
  dVar1 = data->J2;
  sVar2 = data->J1;
  sVar3 = data->m2;
  __x = asin(-data->a);
  dVar6 = cos(__x);
  puVar4 = *(undefined8 **)((long)yy->content + 0x10);
  *puVar4 = 0x3ff921fb54442d18;
  puVar4[1] = dVar6;
  puVar4[2] = __x;
  force(yy,(sunrealtype *)local_38,data);
  lVar5 = *(long *)((long)yp->content + 0x10);
  auVar7._8_8_ = sVar3;
  auVar7._0_8_ = sVar2;
  auVar7 = divpd(local_38,auVar7);
  *(undefined1 (*) [16])(lVar5 + 0x18) = auVar7;
  *(double *)(lVar5 + 0x28) = local_28 / dVar1;
  return;
}

Assistant:

void setIC(N_Vector yy, N_Vector yp, UserData data)
{
  sunrealtype pi;
  sunrealtype a, J1, m2, J2;
  sunrealtype q, p, x;
  sunrealtype Q[3];

  N_VConst(ZERO, yy);
  N_VConst(ZERO, yp);

  pi = FOUR * atan(ONE);

  a  = data->a;
  J1 = data->J1;
  m2 = data->m2;
  J2 = data->J2;

  q = pi / TWO;
  p = asin(-a);
  x = cos(p);

  NV_Ith_S(yy, 0) = q;
  NV_Ith_S(yy, 1) = x;
  NV_Ith_S(yy, 2) = p;

  force(yy, Q, data);

  NV_Ith_S(yp, 3) = Q[0] / J1;
  NV_Ith_S(yp, 4) = Q[1] / m2;
  NV_Ith_S(yp, 5) = Q[2] / J2;
}